

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddressPrivate::setAddress(QHostAddressPrivate *this,quint8 *a_)

{
  QFlags<QHostAddress::ConversionModeFlag> QVar1;
  quint32 *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  *(undefined1 *)(in_RDI + 0x34) = 1;
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)in_RSI;
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RSI + 2);
  *(undefined4 *)(in_RDI + 0x30) = 0;
  QVar1 = ::operator|((enum_type)((ulong)(in_RDI + 0x20) >> 0x20),(enum_type)(in_RDI + 0x20));
  convertToIpv4(in_RSI,(Q_IPV6ADDR *)
                       CONCAT44(QVar1.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>
                                .super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i,
                                in_stack_ffffffffffffffe8),this._4_4_);
  return;
}

Assistant:

void QHostAddressPrivate::setAddress(const quint8 *a_)
{
    protocol = QHostAddress::IPv6Protocol;
    memcpy(a6.c, a_, sizeof(a6));
    a = 0;
    convertToIpv4(a, a6, (QHostAddress::ConvertV4MappedToIPv4
                          | QHostAddress::ConvertUnspecifiedAddress));
}